

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O3

void Cbs_ManDeriveReason(Cbs_Man_t *p,int Level)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  void **ppvVar7;
  Gia_Obj_t **ppGVar8;
  long lVar9;
  Vec_Ptr_t *pVVar10;
  int iVar11;
  size_t sVar12;
  long lVar13;
  int local_40;
  
  lVar13 = (long)(p->pClauses).iHead;
  if ((p->pClauses).pData[lVar13] != (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[pQue->iHead] == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                  ,0x250,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
  }
  lVar13 = lVar13 + 1;
  local_40 = (int)lVar13;
  if ((p->pClauses).iTail <= local_40) {
    __assert_fail("pQue->iHead + 1 < pQue->iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                  ,0x251,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
  }
  p->vTemp->nSize = 0;
  do {
    pGVar3 = (p->pClauses).pData[lVar13];
    if (((uint)*(ulong *)pGVar3 >> 0x1e & 1) != 0) {
      *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xffffffffbfffffff;
      pVVar10 = p->vTemp;
      uVar6 = pVVar10->nSize;
      if (uVar6 == pVVar10->nCap) {
        if ((int)uVar6 < 0x10) {
          if (pVVar10->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar10->pArray,0x80);
          }
          pVVar10->pArray = ppvVar7;
          pVVar10->nCap = 0x10;
        }
        else {
          if (pVVar10->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar10->pArray,(ulong)uVar6 << 4);
          }
          pVVar10->pArray = ppvVar7;
          pVVar10->nCap = uVar6 * 2;
        }
      }
      else {
        ppvVar7 = pVVar10->pArray;
      }
      iVar1 = pVVar10->nSize;
      pVVar10->nSize = iVar1 + 1;
      ppvVar7[iVar1] = pGVar3;
      uVar6 = pGVar3->Value;
      if (uVar6 == 0xffffffff) {
        __assert_fail("pVar->Value != ~0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                      ,99,"int Cbs_VarDecLevel(Cbs_Man_t *, Gia_Obj_t *)");
      }
      uVar5 = uVar6 * 3;
      if ((int)uVar5 < 0) goto LAB_0066d231;
      uVar2 = p->vLevReas->nSize;
      if (uVar2 == uVar5 || SBORROW4(uVar2,uVar5) != (int)(uVar2 + uVar6 * -3) < 0)
      goto LAB_0066d231;
      piVar4 = p->vLevReas->pArray;
      iVar1 = piVar4[uVar5];
      if (iVar1 < Level) {
        ppGVar8 = (p->pClauses).pData;
        lVar9 = (long)local_40;
        local_40 = local_40 + 1;
LAB_0066d114:
        ppGVar8[lVar9] = pGVar3;
        goto LAB_0066d1c7;
      }
      if (iVar1 != Level) {
        __assert_fail("iLitLevel == Level",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                      ,0x26a,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
      }
      if (uVar2 <= uVar5 + 1) goto LAB_0066d231;
      lVar9 = (long)piVar4[uVar5 + 1];
      if (lVar9 == 0) {
        ppGVar8 = (p->pClauses).pData;
        lVar9 = (long)(p->pClauses).iHead;
        if (ppGVar8[lVar9] != (Gia_Obj_t *)0x0) {
          __assert_fail("pQue->pData[pQue->iHead] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                        ,0x26e,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
        }
        goto LAB_0066d114;
      }
      iVar1 = (p->pClauses).iTail;
      if (iVar1 == (p->pClauses).nSize) {
        (p->pClauses).nSize = iVar1 * 2;
        ppGVar8 = (p->pClauses).pData;
        sVar12 = (long)iVar1 << 4;
        if (ppGVar8 == (Gia_Obj_t **)0x0) {
          ppGVar8 = (Gia_Obj_t **)malloc(sVar12);
          (p->pClauses).pData = ppGVar8;
          goto LAB_0066d134;
        }
        ppGVar8 = (Gia_Obj_t **)realloc(ppGVar8,sVar12);
        iVar1 = (p->pClauses).iTail;
        uVar6 = pGVar3->Value;
        (p->pClauses).pData = ppGVar8;
        iVar11 = iVar1 + 1;
        (p->pClauses).iTail = iVar11;
        ppGVar8[iVar1] = pGVar3 + lVar9;
        if (uVar6 == 0xffffffff) {
          __assert_fail("pVar->Value != ~0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                        ,0x65,"Gia_Obj_t *Cbs_VarReason1(Cbs_Man_t *, Gia_Obj_t *)");
        }
      }
      else {
        ppGVar8 = (p->pClauses).pData;
LAB_0066d134:
        iVar11 = iVar1 + 1;
        (p->pClauses).iTail = iVar11;
        ppGVar8[iVar1] = pGVar3 + lVar9;
      }
      uVar6 = uVar6 * 3 + 2;
      if (((int)uVar6 < 0) || (p->vLevReas->nSize <= (int)uVar6)) {
LAB_0066d231:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar9 = (long)p->vLevReas->pArray[uVar6];
      if (lVar9 != 0) {
        if (iVar11 == (p->pClauses).nSize) {
          (p->pClauses).nSize = iVar11 * 2;
          ppGVar8 = (p->pClauses).pData;
          sVar12 = (long)(iVar11 * 2) << 3;
          if (ppGVar8 == (Gia_Obj_t **)0x0) {
            ppGVar8 = (Gia_Obj_t **)malloc(sVar12);
          }
          else {
            ppGVar8 = (Gia_Obj_t **)realloc(ppGVar8,sVar12);
            iVar11 = (p->pClauses).iTail;
          }
          (p->pClauses).pData = ppGVar8;
        }
        else {
          ppGVar8 = (p->pClauses).pData;
        }
        (p->pClauses).iTail = iVar11 + 1;
        ppGVar8[iVar11] = pGVar3 + lVar9;
      }
    }
LAB_0066d1c7:
    lVar13 = lVar13 + 1;
    if ((p->pClauses).iTail <= lVar13) {
      if ((p->pClauses).pData[(p->pClauses).iHead] == (Gia_Obj_t *)0x0) {
        __assert_fail("pQue->pData[pQue->iHead] != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSat.c"
                      ,0x277,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
      }
      (p->pClauses).iTail = local_40;
      pVVar10 = p->vTemp;
      if (0 < pVVar10->nSize) {
        lVar13 = 0;
        do {
          *(ulong *)pVVar10->pArray[lVar13] = *pVVar10->pArray[lVar13] | 0x40000000;
          lVar13 = lVar13 + 1;
          pVVar10 = p->vTemp;
        } while (lVar13 < pVVar10->nSize);
      }
      return;
    }
  } while( true );
}

Assistant:

static inline void Cbs_ManDeriveReason( Cbs_Man_t * p, int Level )
{
    Cbs_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj, * pReason;
    int i, k, iLitLevel;
    assert( pQue->pData[pQue->iHead] == NULL );
    assert( pQue->iHead + 1 < pQue->iTail );
/*
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        assert( pObj->fMark0 == 1 );
    }
*/
    // compact literals
    Vec_PtrClear( p->vTemp );
    for ( i = k = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        if ( !pObj->fMark0 ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fMark0 = 0;
        Vec_PtrPush( p->vTemp, pObj );
        // check decision level
        iLitLevel = Cbs_VarDecLevel( p, pObj );
        if ( iLitLevel < Level )
        {
            pQue->pData[k++] = pObj;
            continue;
        }
        assert( iLitLevel == Level );
        pReason = Cbs_VarReason0( p, pObj );
        if ( pReason == pObj ) // no reason
        {
            assert( pQue->pData[pQue->iHead] == NULL );
            pQue->pData[pQue->iHead] = pObj;
            continue;
        }
        Cbs_QuePush( pQue, pReason );
        pReason = Cbs_VarReason1( p, pObj );
        if ( pReason != pObj ) // second reason
            Cbs_QuePush( pQue, pReason );
    }
    assert( pQue->pData[pQue->iHead] != NULL );
    pQue->iTail = k;
    // clear the marks
    Vec_PtrForEachEntry( Gia_Obj_t *, p->vTemp, pObj, i )
        pObj->fMark0 = 1;
}